

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O2

int __thiscall
Flasher::verify(Flasher *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint8_t data;
  _func_int *p_Var1;
  FlasherObserver *pFVar2;
  Samba *this_00;
  Flash *pFVar3;
  undefined8 uVar4;
  int iVar5;
  EVP_PKEY_CTX *pEVar6;
  uint16_t crc16;
  uint16_t uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  FILE *__stream;
  long lVar12;
  size_t sVar13;
  int *piVar14;
  undefined8 *puVar15;
  uint32_t start_addr;
  pointer_____offset_0x10___ *ppuVar16;
  void *__ptr;
  long lVar17;
  size_t sStack_80;
  int *local_78;
  ulong local_70;
  int *local_68;
  FILE *local_60;
  uint local_54;
  ulong local_50;
  ulong local_48;
  EVP_PKEY_CTX *local_40;
  Flasher *local_38;
  
  local_38 = (Flasher *)CONCAT44(local_38._4_4_,(int)tbs);
  sStack_80 = 0x109839;
  local_40 = ctx;
  uVar8 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[3])();
  local_50 = (ulong)uVar8;
  uVar11 = (ulong)uVar8 + 0xf & 0xfffffffffffffff0;
  __ptr = (void *)((long)&local_78 - uVar11);
  lVar17 = (long)__ptr - uVar11;
  local_68 = (int *)sig;
  sig[0] = '\0';
  sig[1] = '\0';
  sig[2] = '\0';
  sig[3] = '\0';
  uVar10 = (uint)local_38;
  local_78 = (int *)siglen;
  *(undefined4 *)siglen = 0;
  local_70 = ((ulong)local_38 & 0xffffffff) / (ulong)uVar8;
  if ((int)(((ulong)local_38 & 0xffffffff) % (ulong)uVar8) != 0) {
LAB_00109aa3:
    *(undefined8 *)(lVar17 + -8) = 8;
    uVar4 = *(undefined8 *)(lVar17 + -8);
    *(undefined8 *)(lVar17 + -8) = 0x109aab;
    puVar15 = (undefined8 *)__cxa_allocate_exception(uVar4);
    *puVar15 = &PTR__exception_00117388;
    *(undefined8 *)(lVar17 + -8) = 0x109acb;
    __cxa_throw(puVar15,&FlashOffsetError::typeinfo,std::exception::~exception);
  }
  p_Var1 = ((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
            super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
            super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[6];
  *(undefined8 *)(lVar17 + -8) = 0x109890;
  uVar8 = (*p_Var1)();
  pEVar6 = local_40;
  if (uVar8 <= uVar10) goto LAB_00109aa3;
  local_38 = this;
  *(undefined8 *)(lVar17 + -8) = 0x1098ad;
  __stream = fopen((char *)pEVar6,"rb");
  if (__stream == (FILE *)0x0) {
    *(undefined8 *)(lVar17 + -8) = 0x10;
    uVar4 = *(undefined8 *)(lVar17 + -8);
    *(undefined8 *)(lVar17 + -8) = 0x109afb;
    puVar15 = (undefined8 *)__cxa_allocate_exception(uVar4);
    *(undefined8 *)(lVar17 + -8) = 0x109b03;
    piVar14 = __errno_location();
    iVar9 = *piVar14;
    *puVar15 = &PTR__exception_001173b0;
    *(int *)(puVar15 + 1) = iVar9;
    *(undefined8 *)(lVar17 + -8) = 0x109b28;
    __cxa_throw(puVar15,&FileOpenError::typeinfo,std::exception::~exception);
  }
  *(undefined8 *)(lVar17 + -8) = 2;
  uVar4 = *(undefined8 *)(lVar17 + -8);
  *(undefined8 *)(lVar17 + -8) = 0x1098c6;
  iVar9 = fseek(__stream,0,(int)uVar4);
  local_60 = __stream;
  if (iVar9 == 0) {
    *(undefined8 *)(lVar17 + -8) = 0x1098da;
    lVar12 = ftell(__stream);
    if (-1 < lVar12) {
      *(undefined8 *)(lVar17 + -8) = 0x1098ee;
      rewind(__stream);
      local_48 = (long)(local_50 + lVar12 + -1) / (long)local_50;
      p_Var1 = ((local_38->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[4];
      *(undefined8 *)(lVar17 + -8) = 0x109913;
      uVar10 = (*p_Var1)();
      if ((uint)local_48 <= uVar10) {
        pFVar2 = local_38->_observer;
        local_40 = (EVP_PKEY_CTX *)0x0;
        p_Var1 = pFVar2->_vptr_FlasherObserver[2];
        *(undefined8 *)(lVar17 + -8) = 0x10993e;
        (*p_Var1)(pFVar2,"Verify %ld bytes of flash\n",lVar12);
        while( true ) {
          *(undefined8 *)(lVar17 + -8) = 1;
          uVar11 = local_50;
          sVar13 = *(size_t *)(lVar17 + -8);
          *(undefined8 *)(lVar17 + -8) = 0x109950;
          sVar13 = fread(__ptr,sVar13,uVar11,__stream);
          pEVar6 = local_40;
          uVar11 = local_48;
          if (sVar13 == 0) break;
          pFVar2 = local_38->_observer;
          p_Var1 = pFVar2->_vptr_FlasherObserver[3];
          *(undefined8 *)(lVar17 + -8) = 0x109972;
          (*p_Var1)(pFVar2,pEVar6,uVar11);
          if (local_38->_samba->_canChecksumBuffer == true) {
            crc16 = 0;
            uVar10 = 0;
            while( true ) {
              __stream = local_60;
              this_00 = local_38->_samba;
              if (sVar13 <= uVar10) break;
              data = *(uint8_t *)((long)__ptr + (ulong)uVar10);
              *(undefined8 *)(lVar17 + -8) = 0x1099a0;
              crc16 = Samba::checksumCalc(this_00,data,crc16);
              uVar10 = uVar10 + 1;
            }
            local_54 = (int)local_40 + (int)local_70;
            start_addr = local_54 * (int)local_50;
            *(undefined8 *)(lVar17 + -8) = 0x109a06;
            uVar7 = Samba::checksumBuffer(this_00,start_addr,(uint32_t)sVar13);
            if (uVar7 != crc16) {
              pFVar3 = (local_38->_flash->_M_t).
                       super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                       super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                       super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
              uVar11 = (ulong)local_54;
              p_Var1 = pFVar3->_vptr_Flash[0x19];
              *(undefined8 *)(lVar17 + -8) = 0x109a26;
              (*p_Var1)(pFVar3,uVar11,lVar17);
              iVar9 = 0;
              for (uVar10 = 0; uVar11 = (ulong)uVar10, uVar11 < sVar13; uVar10 = uVar10 + 1) {
                iVar9 = iVar9 + (uint)(*(char *)((long)__ptr + uVar11) != *(char *)(lVar17 + uVar11)
                                      );
              }
              goto LAB_00109a45;
            }
          }
          else {
            pFVar3 = (local_38->_flash->_M_t).
                     super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                     super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                     super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
            iVar9 = (int)local_40;
            iVar5 = (int)local_70;
            p_Var1 = pFVar3->_vptr_Flash[0x19];
            *(undefined8 *)(lVar17 + -8) = 0x1099ca;
            (*p_Var1)(pFVar3,(ulong)(uint)(iVar9 + iVar5),lVar17);
            iVar9 = 0;
            for (uVar10 = 0; uVar11 = (ulong)uVar10, uVar11 < sVar13; uVar10 = uVar10 + 1) {
              iVar9 = iVar9 + (uint)(*(char *)((long)__ptr + uVar11) != *(char *)(lVar17 + uVar11));
            }
LAB_00109a45:
            if (iVar9 != 0) {
              *local_68 = *local_68 + 1;
              *local_78 = *local_78 + iVar9;
            }
          }
          uVar10 = (int)local_40 + 1;
          local_40 = (EVP_PKEY_CTX *)(ulong)uVar10;
          if ((uVar10 == (uint)local_48) || (sVar13 != local_50)) break;
        }
        *(undefined8 *)(lVar17 + -8) = 0x109a76;
        fclose(__stream);
        pFVar2 = local_38->_observer;
        uVar11 = local_48 & 0xffffffff;
        p_Var1 = pFVar2->_vptr_FlasherObserver[3];
        *(undefined8 *)(lVar17 + -8) = 0x109a8a;
        (*p_Var1)(pFVar2,uVar11);
        return (int)CONCAT71((int7)((ulong)local_68 >> 8),*local_68 == 0);
      }
      *(undefined8 *)(lVar17 + -8) = 8;
      uVar4 = *(undefined8 *)(lVar17 + -8);
      *(undefined8 *)(lVar17 + -8) = 0x109b30;
      puVar15 = (undefined8 *)__cxa_allocate_exception(uVar4);
      *puVar15 = &PTR__exception_00117400;
      ppuVar16 = &FileSizeError::typeinfo;
      goto LAB_00109b44;
    }
  }
  *(undefined8 *)(lVar17 + -8) = 0x10;
  uVar4 = *(undefined8 *)(lVar17 + -8);
  *(undefined8 *)(lVar17 + -8) = 0x109ad3;
  puVar15 = (undefined8 *)__cxa_allocate_exception(uVar4);
  *(undefined8 *)(lVar17 + -8) = 0x109adb;
  piVar14 = __errno_location();
  iVar9 = *piVar14;
  *puVar15 = &PTR__exception_001173d8;
  *(int *)(puVar15 + 1) = iVar9;
  ppuVar16 = &FileIoError::typeinfo;
LAB_00109b44:
  *(undefined1 **)(lVar17 + -8) = &LAB_00109b53;
  __cxa_throw(puVar15,ppuVar16,std::exception::~exception);
}

Assistant:

bool
Flasher::verify(const char* filename, uint32_t& pageErrors, uint32_t& totalErrors, uint32_t foffset)
{
    FILE* infile;
    uint32_t pageSize = _flash->pageSize();
    uint8_t bufferA[pageSize];
    uint8_t bufferB[pageSize];
    uint32_t pageNum = 0;
    uint32_t numPages;
    uint32_t pageOffset;
    uint32_t byteErrors = 0;
    uint16_t calcCrc = 0;
    uint16_t flashCrc;
    long fsize;
    size_t fbytes;

    pageErrors = 0;
    totalErrors = 0;

    if (foffset % pageSize != 0 || foffset >= _flash->totalSize())
        throw FlashOffsetError();
    
    pageOffset = foffset / pageSize;
    
    infile = fopen(filename, "rb");
    if (!infile)
        throw FileOpenError(errno);

    try
    {
        if (fseek(infile, 0, SEEK_END) != 0 || (fsize = ftell(infile)) < 0)
            throw FileIoError(errno);
        
        rewind(infile);

        numPages = (fsize + pageSize - 1) / pageSize;
        if (numPages > _flash->numPages())
            throw FileSizeError();

        _observer.onStatus("Verify %ld bytes of flash\n", fsize);

        while ((fbytes = fread(bufferA, 1, pageSize, infile)) > 0)
        {
            byteErrors = 0;
            calcCrc = 0;
            _observer.onProgress(pageNum, numPages);

            if (_samba.canChecksumBuffer())
            {
                for (uint32_t i = 0; i < fbytes; i++)
                    calcCrc = _samba.checksumCalc(bufferA[i], calcCrc);
                
                

                flashCrc = _samba.checksumBuffer((pageOffset + pageNum) * pageSize, fbytes);
                
                if (flashCrc != calcCrc)
                {
                    _flash->readPage(pageOffset + pageNum, bufferB);

                    for (uint32_t i = 0; i < fbytes; i++)
                    {
                        if (bufferA[i] != bufferB[i])
                            byteErrors++;
                    }
                }
            }
            else
            {
                _flash->readPage(pageOffset + pageNum, bufferB);

                for (uint32_t i = 0; i < fbytes; i++)
                {
                    if (bufferA[i] != bufferB[i])
                        byteErrors++;
                }
            }
            
            if (byteErrors != 0)
            {
                pageErrors++;
                totalErrors += byteErrors;
            }

            pageNum++;
            if (pageNum == numPages || fbytes != pageSize)
                break;
        }
    }
    catch(...)
    {
        fclose(infile);
        throw;
    }
    
    fclose(infile);

     _observer.onProgress(numPages, numPages);
    
    if (pageErrors != 0)
        return false;

    return true;
}